

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
pstore::uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>
          (uint128 *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0x7c;
  do {
    uVar1 = *(ulong *)((long)&this->v_ + 8);
    bVar2 = (byte)uVar3 & 0x3f;
    uVar4 = (uint)((ulong)this->v_ >> bVar2) | (uint)(uVar1 << 0x40 - bVar2);
    if ((uVar3 & 0x40) != 0) {
      uVar4 = (uint)(uVar1 >> ((byte)uVar3 & 0x3f));
    }
    digit_to_hex(uVar4 & 0xf);
    std::__cxx11::string::push_back((char)out.container);
    uVar3 = uVar3 - 4;
  } while (uVar3 != 0xfffffffc);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator uint128::to_hex (OutputIterator out) const noexcept {
#ifndef NDEBUG
        auto emitted = 0U;
#endif
#ifdef PSTORE_HAVE_UINT128_T
        for (auto shift = 4U; shift <= 128U; shift += 4U) {
            *(out++) = digit_to_hex ((v_ >> (128U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#else
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((high_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((low_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#endif
        PSTORE_ASSERT (emitted == hex_string_length);
        return out;
    }